

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglshaderprogram.h
# Opt level: O0

GLint __thiscall rengine::OpenGLShaderProgram::resolve(OpenGLShaderProgram *this,char *name)

{
  ostream *poVar1;
  string local_40 [36];
  int local_1c;
  char *pcStack_18;
  GLint id;
  char *name_local;
  OpenGLShaderProgram *this_local;
  
  pcStack_18 = name;
  name_local = (char *)this;
  local_1c = glGetUniformLocation(this->m_id,name);
  if (local_1c < 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"E [");
    log_timestring_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,local_40);
    poVar1 = std::operator<<(poVar1,"]: ");
    poVar1 = std::operator<<(poVar1,"GLint rengine::OpenGLShaderProgram::resolve(const char *)");
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"failed to resolve uniform: \'");
    poVar1 = std::operator<<(poVar1,pcStack_18);
    poVar1 = std::operator<<(poVar1,"\'..");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x36,"GLint rengine::OpenGLShaderProgram::resolve(const char *)");
  }
  return local_1c;
}

Assistant:

GLint resolve(const char *name) {
        GLint id = glGetUniformLocation(m_id, name);
        if (id < 0) {
            loge << "failed to resolve uniform: '" << name << "'.." << std::endl;
            assert(false);
        }
        return id;
    }